

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O3

char * afm_parser_next_key(AFM_Parser parser,FT_Bool line,FT_Offset *len)

{
  long *plVar1;
  char *pcVar2;
  long lVar3;
  undefined7 in_register_00000031;
  
  plVar1 = (long *)CONCAT71(in_register_00000031,line);
  if (*(int *)&parser->get_index < 2) {
    afm_stream_read_string((AFM_Stream)parser);
  }
  do {
    *(undefined4 *)&parser->get_index = 0;
    pcVar2 = afm_stream_read_one((AFM_Stream)parser);
    if (pcVar2 != (char *)0x0) {
      if (plVar1 == (long *)0x0) {
        return pcVar2;
      }
      lVar3 = (long)&parser->memory->user + ~(ulong)pcVar2;
      goto LAB_0014e988;
    }
  } while (*(int *)&parser->get_index == 2);
  lVar3 = 0;
  if (plVar1 == (long *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
LAB_0014e988:
    *plVar1 = lVar3;
  }
  return pcVar2;
}

Assistant:

FT_LOCAL_DEF( char* )
  afm_parser_next_key( AFM_Parser  parser,
                       FT_Bool     line,
                       FT_Offset*  len )
  {
    AFM_Stream  stream = parser->stream;
    char*       key    = NULL;  /* make stupid compiler happy */


    if ( line )
    {
      while ( 1 )
      {
        /* skip current line */
        if ( !AFM_STATUS_EOL( stream ) )
          afm_stream_read_string( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty line */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOL( stream )  )
          continue;

        break;
      }
    }
    else
    {
      while ( 1 )
      {
        /* skip current column */
        while ( !AFM_STATUS_EOC( stream ) )
          afm_stream_read_one( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty column */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOC( stream )  )
          continue;

        break;
      }
    }

    if ( len )
      *len = ( key ) ? (FT_Offset)AFM_STREAM_KEY_LEN( stream, key )
                     : 0;

    return key;
  }